

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O2

MPP_RET hal_m2vd_vdpu1_deinit(void *hal)

{
  MPP_RET MVar1;
  char *fmt;
  
  if (*(MppDev *)((long)hal + 0x90) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x90));
    *(undefined8 *)((long)hal + 0x90) = 0;
  }
  if (*(MppBuffer *)((long)hal + 0x78) != (MppBuffer)0x0) {
    MVar1 = mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x78),"hal_m2vd_vdpu1_deinit");
    *(undefined8 *)((long)hal + 0x78) = 0;
    if (MVar1 != MPP_OK) {
      fmt = "m2v_hal qp_table put buffer failed\n";
      goto LAB_001f07b3;
    }
  }
  if (*(MppBufferGroup *)((long)hal + 0x70) == (MppBufferGroup)0x0) {
    return MPP_OK;
  }
  MVar1 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x70));
  *(undefined8 *)((long)hal + 0x70) = 0;
  if (MVar1 == MPP_OK) {
    return MPP_OK;
  }
  fmt = "m2v_hal group free buffer failed\n";
LAB_001f07b3:
  _mpp_log_l(2,"hal_m2vd_vdpu1",fmt,(char *)0x0);
  return MVar1;
}

Assistant:

MPP_RET hal_m2vd_vdpu1_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *p = (M2vdHalCtx *)hal;

    if (p->dev) {
        mpp_dev_deinit(p->dev);
        p->dev = NULL;
    }

    if (p->qp_table) {
        ret = mpp_buffer_put(p->qp_table);
        p->qp_table = NULL;
        if (MPP_OK !=  ret) {
            mpp_err("m2v_hal qp_table put buffer failed\n");
            return ret;
        }
    }

    if (p->group) {
        ret = mpp_buffer_group_put(p->group);
        p->group = NULL;
        if (ret) {
            mpp_err("m2v_hal group free buffer failed\n");
            return ret;
        }
    }

    return ret;
}